

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

cmInstallTargetGenerator *
CreateInstallTargetGenerator
          (cmTarget *target,cmInstallCommandArguments *args,bool impLib,bool forceOpt)

{
  char *dest;
  char *file_permissions;
  char *component;
  bool bVar1;
  MessageLevel message;
  cmInstallTargetGenerator *this;
  string *psVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations;
  
  message = cmInstallGenerator::SelectMessageLevel(target->Makefile,false);
  target->HaveInstallRule = true;
  this = (cmInstallTargetGenerator *)operator_new(0x108);
  psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
  dest = (psVar2->_M_dataplus)._M_p;
  psVar2 = cmInstallCommandArguments::GetPermissions_abi_cxx11_(args);
  file_permissions = (psVar2->_M_dataplus)._M_p;
  configurations = cmInstallCommandArguments::GetConfigurations_abi_cxx11_(args);
  psVar2 = cmInstallCommandArguments::GetComponent_abi_cxx11_(args);
  component = (psVar2->_M_dataplus)._M_p;
  bVar1 = cmInstallCommandArguments::GetOptional(args);
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (this,&target->Name,dest,impLib,file_permissions,configurations,component,message,
             bVar1 || forceOpt);
  return this;
}

Assistant:

static cmInstallTargetGenerator* CreateInstallTargetGenerator(cmTarget& target,
     const cmInstallCommandArguments& args, bool impLib, bool forceOpt = false)
{
  cmInstallGenerator::MessageLevel message =
    cmInstallGenerator::SelectMessageLevel(target.GetMakefile());
  target.SetHaveInstallRule(true);
  return new cmInstallTargetGenerator(target.GetName(),
                        args.GetDestination().c_str(),
                        impLib, args.GetPermissions().c_str(),
                        args.GetConfigurations(), args.GetComponent().c_str(),
                        message,
                        args.GetOptional() || forceOpt);
}